

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::Server::handle_file_request(Server *this,Request *req,Response *res,bool head)

{
  char cVar1;
  size_t in_length;
  bool bVar2;
  size_type sVar3;
  mmap *pmVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  byte bVar6;
  int iVar7;
  long *plVar8;
  char *pcVar9;
  _Rb_tree_node_base *p_Var10;
  undefined7 in_register_00000009;
  size_type *psVar11;
  char **__args;
  string *psVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer pMVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  string sub_path;
  shared_ptr<httplib::detail::mmap> mm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  stat st;
  undefined1 local_1ad;
  undefined4 local_1ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string *local_188;
  mmap *local_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined4 local_16c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  Server *local_148;
  Response *local_140;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  _Any_data *local_118;
  Request *local_110;
  string *local_108;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_100;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_f8;
  pointer local_f0;
  _Any_data local_e8;
  code *local_d8;
  undefined8 uStack_d0;
  undefined1 local_c0 [144];
  
  local_16c = (undefined4)CONCAT71(in_register_00000009,head);
  pMVar13 = (this->base_dirs_).
            super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_f0 = (this->base_dirs_).
             super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar13 != local_f0) {
    psVar12 = &req->path;
    local_f8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&res->headers;
    local_100 = &this->file_extension_and_mimetype_map_;
    local_108 = &this->default_file_mimetype_;
    local_118 = (_Any_data *)&this->file_request_handler_;
    local_1ac = SUB84(local_118,0);
    local_188 = psVar12;
    local_148 = this;
    local_140 = res;
    local_110 = req;
    do {
      iVar7 = std::__cxx11::string::compare
                        ((ulong)psVar12,0,(string *)(pMVar13->mount_point)._M_string_length);
      bVar2 = true;
      if (iVar7 == 0) {
        std::__cxx11::string::substr((ulong)local_c0,(ulong)psVar12);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0x199abd);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_1a8.field_2._M_allocated_capacity = *psVar11;
          local_1a8.field_2._8_8_ = plVar8[3];
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar11;
          local_1a8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_1a8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
          operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
        }
        if (local_1a8._M_string_length == 0) {
          uVar16 = 0;
        }
        else {
          uVar15 = 0;
          do {
            uVar16 = uVar15;
            if (local_1a8._M_dataplus._M_p[uVar15] != '/') break;
            uVar15 = uVar15 + 1;
            uVar16 = local_1a8._M_string_length;
          } while (local_1a8._M_string_length != uVar15);
        }
        lVar14 = 0;
        do {
          uVar15 = uVar16;
          sVar3 = local_1a8._M_string_length;
          uVar16 = uVar15;
          if (local_1a8._M_string_length <= uVar15) goto LAB_00141c44;
          do {
            uVar17 = uVar16;
            if (local_1a8._M_dataplus._M_p[uVar16] == '/') break;
            uVar16 = uVar16 + 1;
            uVar17 = local_1a8._M_string_length;
          } while (local_1a8._M_string_length != uVar16);
          iVar7 = std::__cxx11::string::compare((ulong)&local_1a8,uVar15,(char *)(uVar17 - uVar15));
          uVar16 = uVar17;
          if (iVar7 == 0) {
LAB_00141bf3:
            bVar2 = true;
            if (uVar17 < local_1a8._M_string_length) {
              do {
                uVar16 = uVar17;
                if (local_1a8._M_dataplus._M_p[uVar17] != '/') break;
                uVar17 = uVar17 + 1;
                uVar16 = local_1a8._M_string_length;
              } while (local_1a8._M_string_length != uVar17);
            }
          }
          else {
            iVar7 = std::__cxx11::string::compare
                              ((ulong)&local_1a8,uVar15,(char *)(uVar17 - uVar15));
            if (iVar7 != 0) {
              lVar14 = lVar14 + 1;
              goto LAB_00141bf3;
            }
            if (lVar14 != 0) {
              lVar14 = lVar14 + -1;
              goto LAB_00141bf3;
            }
            lVar14 = 0;
            bVar2 = false;
          }
        } while (bVar2);
        bVar2 = true;
        psVar12 = local_188;
        if (sVar3 <= uVar15) {
LAB_00141c44:
          std::operator+(&local_168,&pMVar13->base_dir,&local_1a8);
          if (local_168._M_dataplus._M_p[local_168._M_string_length - 1] == '/') {
            std::__cxx11::string::append((char *)&local_168);
          }
          iVar7 = stat(local_168._M_dataplus._M_p,(stat *)local_c0);
          bVar18 = (local_c0._24_4_ & 0xf000) != 0x8000;
          bVar2 = bVar18 || iVar7 < 0;
          psVar12 = local_188;
          if (!bVar18 && iVar7 >= 0) {
            for (p_Var10 = (pMVar13->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var10 != &(pMVar13->headers)._M_t._M_impl.super__Rb_tree_header
                ; p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_c0,*(char **)(p_Var10 + 1),(allocator<char> *)&local_180);
              cVar1 = *(char *)local_c0._0_8_;
              pcVar9 = (char *)local_c0._0_8_;
              while (((cVar1 != '\0' && (pcVar9 = pcVar9 + 1, cVar1 != '\n')) && (cVar1 != '\r'))) {
                cVar1 = *pcVar9;
              }
              if (cVar1 == '\0') {
                pcVar9 = *(char **)(p_Var10 + 2);
                cVar1 = *pcVar9;
                while (((cVar1 != '\0' && (pcVar9 = pcVar9 + 1, cVar1 != '\n')) && (cVar1 != '\r')))
                {
                  cVar1 = *pcVar9;
                }
                if (cVar1 == '\0') {
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                            (local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var10 + 2));
                }
              }
              if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
                operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
              }
            }
            local_180 = (mmap *)0x0;
            __args = (char **)local_c0;
            local_c0._0_8_ = local_168._M_dataplus._M_p;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<httplib::detail::mmap,std::allocator<httplib::detail::mmap>,char_const*>
                      (&local_178,&local_180,(allocator<httplib::detail::mmap> *)&local_1ad,__args);
            bVar18 = local_180->addr_ != (void *)0x0;
            local_1ac = (undefined4)CONCAT71((int7)((ulong)__args >> 8),bVar18);
            psVar12 = local_188;
            if (bVar18) {
              in_length = local_180->size_;
              detail::find_content_type((string *)local_c0,&local_168,local_100,local_108);
              _Var5._M_pi = local_178._M_pi;
              pmVar4 = local_180;
              if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_178._M_pi)->_M_use_count = (local_178._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_178._M_pi)->_M_use_count = (local_178._M_pi)->_M_use_count + 1;
                }
              }
              local_128 = (code *)0x0;
              pcStack_120 = (code *)0x0;
              local_138._M_unused._M_object = (void *)0x0;
              local_138._8_8_ = 0;
              local_138._M_unused._M_object = operator_new(0x10);
              *(mmap **)local_138._M_unused._0_8_ = pmVar4;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)local_138._M_unused._0_8_ + 8) = _Var5._M_pi;
              pcStack_120 = std::
                            _Function_handler<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/examples/server/httplib.h:6095:15)>
                            ::_M_invoke;
              local_128 = std::
                          _Function_handler<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/examples/server/httplib.h:6095:15)>
                          ::_M_manager;
              local_e8._M_unused._M_object = (void *)0x0;
              local_e8._8_8_ = 0;
              local_d8 = (code *)0x0;
              uStack_d0 = 0;
              Response::set_content_provider
                        (local_140,in_length,(string *)local_c0,(ContentProvider *)&local_138,
                         (ContentProviderResourceReleaser *)&local_e8);
              psVar12 = local_188;
              if (local_d8 != (code *)0x0) {
                (*local_d8)(&local_e8,&local_e8,__destroy_functor);
              }
              if (local_128 != (code *)0x0) {
                (*local_128)(&local_138,&local_138,__destroy_functor);
              }
              if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
                operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
              }
              if (((char)local_16c == '\0') &&
                 ((local_148->file_request_handler_).super__Function_base._M_manager !=
                  (_Manager_type)0x0)) {
                (*(local_148->file_request_handler_)._M_invoker)(local_118,local_110,local_140);
              }
            }
            if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
      }
      if (!bVar2) {
        bVar6 = (byte)local_1ac;
        goto LAB_00141fb1;
      }
      pMVar13 = pMVar13 + 1;
    } while (pMVar13 != local_f0);
  }
  bVar6 = 0;
LAB_00141fb1:
  return (bool)(bVar6 & 1);
}

Assistant:

inline bool Server::handle_file_request(const Request &req, Response &res,
                                        bool head) {
  for (const auto &entry : base_dirs_) {
    // Prefix match
    if (!req.path.compare(0, entry.mount_point.size(), entry.mount_point)) {
      std::string sub_path = "/" + req.path.substr(entry.mount_point.size());
      if (detail::is_valid_path(sub_path)) {
        auto path = entry.base_dir + sub_path;
        if (path.back() == '/') { path += "index.html"; }

        if (detail::is_file(path)) {
          for (const auto &kv : entry.headers) {
            res.set_header(kv.first.c_str(), kv.second);
          }

          auto mm = std::make_shared<detail::mmap>(path.c_str());
          if (!mm->is_open()) { return false; }

          res.set_content_provider(
              mm->size(),
              detail::find_content_type(path, file_extension_and_mimetype_map_,
                                        default_file_mimetype_),
              [mm](size_t offset, size_t length, DataSink &sink) -> bool {
                sink.write(mm->data() + offset, length);
                return true;
              });

          if (!head && file_request_handler_) {
            file_request_handler_(req, res);
          }

          return true;
        }
      }
    }
  }
  return false;
}